

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_null_implementation.cpp
# Opt level: O0

void __thiscall hrgls::API::~API(API *this)

{
  API_private *this_00;
  ostream *this_01;
  API *this_local;
  
  if (this->m_private != (API_private *)0x0) {
    if (200 < this->m_private->verbosity) {
      this_01 = std::operator<<((ostream *)&std::cout,"API::~API(): Destroying API:");
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    }
    this->m_private->quitThread = true;
    std::thread::join();
  }
  this_00 = this->m_private;
  if (this_00 != (API_private *)0x0) {
    API_private::~API_private(this_00);
    operator_delete(this_00);
  }
  return;
}

Assistant:

API::~API()
  {
    // Stop my thread.
    if (m_private) {
        if (m_private->verbosity > 200) {
          std::cout << "API::~API(): Destroying API:" << std::endl;
        }
        m_private->quitThread = true;
        m_private->myThread.join();
    }

    delete m_private;
  }